

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O1

MethodHandle * __thiscall
jsonrpccxx::GetHandle<Product_const&,std::__cxx11::string_const&>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          function<const_Product_&(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *f)

{
  function<const_Product_&(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *method;
  _Any_data local_30;
  _Manager_type local_20;
  
  std::
  function<const_Product_&(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<const_Product_&(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_30,
             (function<const_Product_&(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)this);
  methodHandle<Product_const&,std::__cxx11::string_const&>
            (__return_storage_ptr__,(jsonrpccxx *)local_30._M_pod_data,method);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

MethodHandle GetHandle(std::function<ReturnType(ParamTypes...)> f) {
    return methodHandle(f);
  }